

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# em.cpp
# Opt level: O2

void __thiscall merlin::em::run(em *this)

{
  ostream *poVar1;
  int i;
  int iVar2;
  EVP_PKEY_CTX *in_RSI;
  double dVar3;
  double dVar4;
  double local_38;
  
  init(this,in_RSI);
  poVar1 = std::operator<<((ostream *)&std::cout,"[EM] Begin parameter learning ...");
  std::endl<char,std::char_traits<char>>(poVar1);
  local_38 = 0.0;
  iVar2 = 0;
  dVar3 = timeSystem();
  do {
    if (this->m_iterations <= iVar2) {
LAB_00150740:
      poVar1 = std::operator<<((ostream *)&std::cout,"[EM] Finished parameter learning");
      std::endl<char,std::char_traits<char>>(poVar1);
      std::operator<<((ostream *)&std::cout,"[EM] Time elapsed is ");
      dVar4 = timeSystem();
      poVar1 = std::ostream::_M_insert<double>(dVar4 - dVar3);
      poVar1 = std::operator<<(poVar1," seconds");
      std::endl<char,std::char_traits<char>>(poVar1);
      return;
    }
    e_step(this);
    m_step(this);
    poVar1 = std::operator<<((ostream *)&std::cout," ");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,iVar2);
    std::operator<<(poVar1,": log-likelihood = ");
    poVar1 = std::ostream::_M_insert<double>(this->m_loglikelihood);
    std::endl<char,std::char_traits<char>>(poVar1);
    if (ABS(this->m_loglikelihood - local_38) <= this->m_epsilon) {
      std::operator<<((ostream *)&std::cout,"[EM] Converged to log-likelihood ");
      poVar1 = std::ostream::_M_insert<double>(this->m_loglikelihood);
      poVar1 = std::operator<<(poVar1," after ");
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,iVar2);
      poVar1 = std::operator<<(poVar1," iterations");
      std::endl<char,std::char_traits<char>>(poVar1);
      goto LAB_00150740;
    }
    iVar2 = iVar2 + 1;
    local_38 = this->m_loglikelihood;
  } while( true );
}

Assistant:

void em::run() {

	// Initialize the algorithm
	init();
	std::cout << "[EM] Begin parameter learning ..." << std::endl;
	double timeStart = timeSystem();

	// Iterate the e-step and the m-step over the dataset
	double loglikelihood = 0;
	for (int i = 0; i < m_iterations; ++i) {
		e_step();
		m_step();
		std::cout << " " << i << ": log-likelihood = " << m_loglikelihood << std::endl;

		double delta = std::fabs(m_loglikelihood - loglikelihood);
		if (delta <= m_epsilon) {
			std::cout << "[EM] Converged to log-likelihood "
					<< m_loglikelihood << " after " << i << " iterations" << std::endl;
			break; // converged skip this for now
		}

		loglikelihood = m_loglikelihood;
	}

	std::cout << "[EM] Finished parameter learning" << std::endl;
	std::cout << "[EM] Time elapsed is " << (timeSystem() - timeStart) << " seconds" << std::endl;
}